

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TypeValidator::validateSingleVariable
          (TypeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  InterfaceBlock *pIVar2;
  DataType DVar3;
  DataType DVar4;
  char *pcVar5;
  allocator<char> local_1a1;
  undefined1 local_1a0 [384];
  
  pIVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1].m_data.block;
  local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying type, expecting ");
  pcVar5 = glu::getDataTypeName((pIVar2->layout).offset);
  std::operator<<((ostream *)poVar1,pcVar5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  DVar4 = (pIVar2->layout).offset;
  DVar3 = glu::getDataTypeFromGLType(propValue);
  if (DVar4 != DVar3) {
    local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tError, got ");
    DVar4 = glu::getDataTypeFromGLType(propValue);
    pcVar5 = glu::getDataTypeName(DVar4);
    std::operator<<((ostream *)poVar1,pcVar5);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,"resource type invalid",&local_1a1);
    PropValidator::setError((PropValidator *)this,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
  }
  return;
}

Assistant:

void TypeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const glu::VarType* variable = path.back().getVariableType();

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying type, expecting " << glu::getDataTypeName(variable->getBasicType()) << tcu::TestLog::EndMessage;

	if (variable->getBasicType() != glu::getDataTypeFromGLType(propValue))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << glu::getDataTypeName(glu::getDataTypeFromGLType(propValue)) << tcu::TestLog::EndMessage;
		setError("resource type invalid");
	}
}